

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-access-set.hxx
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
__thiscall
andres::RandomAccessSet<int,_std::less<int>,_std::allocator<int>_>::insert
          (RandomAccessSet<int,_std::less<int>,_std::allocator<int>_> *this,value_type *value)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __position;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  pair<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
  pVar2;
  int local_18;
  value_type local_14;
  
  local_14 = *value;
  __position._M_current = (int *)lower_bound(this,&local_14);
  if ((__position._M_current ==
       (this->vector_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish) || (*value < *__position._M_current)) {
    _local_18 = CONCAT44(local_14,*value);
    __position._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::_M_insert_rval
                          (&this->vector_,(const_iterator)__position._M_current,&local_18);
    uVar1 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar1 = 0;
  }
  pVar2._8_8_ = uVar1;
  pVar2.first._M_current = __position._M_current;
  return pVar2;
}

Assistant:

inline std::pair<typename RandomAccessSet<Key, Comparison, Allocator>::const_iterator, bool>
RandomAccessSet<Key, Comparison, Allocator>::insert(
    const typename RandomAccessSet<Key, Comparison, Allocator>::value_type& value
) {
    bool found(true);
    iterator i(lower_bound(static_cast<Key>(value)));
    if(i == end() || compare_(static_cast<Key>(value), *i)) {
        i = vector_.insert(i, static_cast<Key>(value));
        found = false;
    }
    return std::make_pair(i, !found);
}